

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O2

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_true>_>,_const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_-1,_1,_false>_>_>,_0,_0>
       ::run(redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_false>_>_>
             *mat,scalar_sum_op<double,_double> *func)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  long lVar4;
  Scalar SVar5;
  
  lVar1 = (mat->m_xpr->m_rhs).
          super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_false,_true>
          .
          super_MapBase<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_false>,_0>
          .m_rows.m_value;
  if (0 < lVar1) {
    pdVar2 = (mat->m_evaluator).
             super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
             .m_lhsImpl.
             super_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>_>
             .
             super_unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_Eigen::internal::IndexBased,_double>
             .m_argImpl.
             super_evaluator<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>
             .
             super_block_evaluator<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
             .
             super_mapbase_evaluator<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
             .m_data;
    pdVar3 = (mat->m_evaluator).
             super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
             .m_rhsImpl.
             super_evaluator<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_false>_>
             .
             super_block_evaluator<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_false,_true>
             .
             super_mapbase_evaluator<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
             .m_data;
    SVar5 = *pdVar2 * *pdVar3;
    for (lVar4 = 1;
        pdVar3 = pdVar3 + (mat->m_evaluator).
                          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                          .m_rhsImpl.
                          super_evaluator<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_false>_>
                          .
                          super_block_evaluator<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_false,_true>
                          .
                          super_mapbase_evaluator<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                          .m_innerStride.m_value, lVar1 != lVar4; lVar4 = lVar4 + 1) {
      SVar5 = SVar5 + pdVar2[lVar4] * *pdVar3;
    }
    return SVar5;
  }
  __assert_fail("mat.rows()>0 && mat.cols()>0 && \"you are using an empty matrix\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/Redux.h"
                ,0xc0,
                "static Scalar Eigen::internal::redux_impl<Eigen::internal::scalar_sum_op<double>, Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, 1, -1, true>>, const Eigen::Block<const Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, -1, 1>>>>::run(const Derived &, const Func &) [Func = Eigen::internal::scalar_sum_op<double>, Derived = Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, 1, -1, true>>, const Eigen::Block<const Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, -1, 1>>>, Traversal = 0, Unrolling = 0]"
               );
}

Assistant:

Scalar run(const Derived &mat, const Func& func)
  {
    eigen_assert(mat.rows()>0 && mat.cols()>0 && "you are using an empty matrix");
    Scalar res;
    res = mat.coeffByOuterInner(0, 0);
    for(Index i = 1; i < mat.innerSize(); ++i)
      res = func(res, mat.coeffByOuterInner(0, i));
    for(Index i = 1; i < mat.outerSize(); ++i)
      for(Index j = 0; j < mat.innerSize(); ++j)
        res = func(res, mat.coeffByOuterInner(i, j));
    return res;
  }